

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroller.cpp
# Opt level: O0

void __thiscall QtMWidgets::Scroller::Scroller(Scroller *this,QObject *target,QObject *parent)

{
  ScrollerPrivate *pSVar1;
  ScrollerPrivate *this_00;
  Object local_60 [8];
  code *local_58;
  undefined8 uStack_50;
  code *local_48;
  undefined8 local_40;
  Object local_38 [24];
  QObject *local_20;
  QObject *parent_local;
  QObject *target_local;
  Scroller *this_local;
  
  local_20 = parent;
  parent_local = target;
  target_local = &this->super_QObject;
  QObject::QObject(&this->super_QObject,parent);
  *(undefined ***)this = &PTR_metaObject_00247cb0;
  pSVar1 = (ScrollerPrivate *)operator_new(0x78);
  ScrollerPrivate::ScrollerPrivate(pSVar1,this,parent_local);
  QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>::
  QScopedPointer(&this->d,pSVar1);
  this_00 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
            ::operator->(&this->d);
  ScrollerPrivate::init(this_00,(EVP_PKEY_CTX *)pSVar1);
  pSVar1 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
           ::operator->(&this->d);
  local_48 = QVariantAnimation::valueChanged;
  local_40 = 0;
  local_58 = _q_animation;
  uStack_50 = 0;
  QObject::
  connect<void(QVariantAnimation::*)(QVariant_const&),void(QtMWidgets::Scroller::*)(QVariant_const&)>
            (local_38,(offset_in_QVariantAnimation_to_subr)pSVar1->scrollAnimation,
             (Object *)QVariantAnimation::valueChanged,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  pSVar1 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
           ::operator->(&this->d);
  QObject::connect<void(QAbstractAnimation::*)(),void(QtMWidgets::Scroller::*)()>
            (local_60,(offset_in_QAbstractAnimation_to_subr)pSVar1->scrollAnimation,
             (Object *)QAbstractAnimation::finished,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  return;
}

Assistant:

Scroller::Scroller( QObject * target, QObject * parent )
	:	QObject( parent )
	,	d( new ScrollerPrivate( this, target ) )
{
	d->init();

	connect( d->scrollAnimation, &QVariantAnimation::valueChanged,
		this, &Scroller::_q_animation );

	connect( d->scrollAnimation, &QVariantAnimation::finished,
		this, &Scroller::_q_animationFinished );
}